

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O3

OSQPSettings *
osqp::anon_unknown_6::ToInternalSettings
          (OSQPSettings *__return_storage_ptr__,OsqpSettings *settings)

{
  bool bVar1;
  double dVar2;
  
  dVar2 = settings->sigma;
  __return_storage_ptr__->rho = settings->rho;
  __return_storage_ptr__->sigma = dVar2;
  __return_storage_ptr__->scaling = settings->scaling;
  __return_storage_ptr__->adaptive_rho = (ulong)settings->adaptive_rho;
  __return_storage_ptr__->adaptive_rho_interval = settings->adaptive_rho_interval;
  dVar2 = settings->adaptive_rho_fraction;
  __return_storage_ptr__->adaptive_rho_tolerance = settings->adaptive_rho_tolerance;
  __return_storage_ptr__->adaptive_rho_fraction = dVar2;
  __return_storage_ptr__->max_iter = settings->max_iter;
  dVar2 = settings->eps_rel;
  __return_storage_ptr__->eps_abs = settings->eps_abs;
  __return_storage_ptr__->eps_rel = dVar2;
  dVar2 = settings->eps_dual_inf;
  __return_storage_ptr__->eps_prim_inf = settings->eps_prim_inf;
  __return_storage_ptr__->eps_dual_inf = dVar2;
  __return_storage_ptr__->alpha = settings->alpha;
  __return_storage_ptr__->delta = settings->delta;
  __return_storage_ptr__->polish = (ulong)settings->polish;
  __return_storage_ptr__->polish_refine_iter = settings->polish_refine_iter;
  __return_storage_ptr__->verbose = (ulong)settings->verbose;
  __return_storage_ptr__->scaled_termination = (ulong)settings->scaled_termination;
  __return_storage_ptr__->check_termination = settings->check_termination;
  bVar1 = settings->warm_start;
  __return_storage_ptr__->warm_start = (c_int)(ulong)bVar1;
  __return_storage_ptr__->time_limit = settings->time_limit;
  __return_storage_ptr__->linsys_solver = QDLDL_SOLVER;
  return (OSQPSettings *)(ulong)bVar1;
}

Assistant:

::OSQPSettings ToInternalSettings(const OsqpSettings& settings) {
  OSQPSettings osqp_settings;
  osqp_settings.rho = settings.rho;
  osqp_settings.sigma = settings.sigma;
  osqp_settings.scaling = settings.scaling;
  osqp_settings.adaptive_rho = settings.adaptive_rho;
  osqp_settings.adaptive_rho_interval = settings.adaptive_rho_interval;
  osqp_settings.adaptive_rho_tolerance = settings.adaptive_rho_tolerance;
  osqp_settings.adaptive_rho_fraction = settings.adaptive_rho_fraction;
  osqp_settings.max_iter = settings.max_iter;
  osqp_settings.eps_abs = settings.eps_abs;
  osqp_settings.eps_rel = settings.eps_rel;
  osqp_settings.eps_prim_inf = settings.eps_prim_inf;
  osqp_settings.eps_dual_inf = settings.eps_dual_inf;
  osqp_settings.alpha = settings.alpha;
  osqp_settings.delta = settings.delta;
  osqp_settings.polish = settings.polish;
  osqp_settings.polish_refine_iter = settings.polish_refine_iter;
  osqp_settings.verbose = settings.verbose;
  osqp_settings.scaled_termination = settings.scaled_termination;
  osqp_settings.check_termination = settings.check_termination;
  osqp_settings.warm_start = settings.warm_start;
  osqp_settings.time_limit = settings.time_limit;
  osqp_settings.linsys_solver = ::QDLDL_SOLVER;
  return osqp_settings;
}